

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackgroundCommand.h
# Opt level: O0

PerftCommandHandle * __thiscall
senjo::PerftCommandHandle::Usage_abi_cxx11_(PerftCommandHandle *this)

{
  long in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [40];
  PerftCommandHandle *this_local;
  
  this_local = this;
  std::operator+(local_58,(char *)(in_RSI + 0x48));
  std::operator+(local_38,local_58);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (char *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string((string *)local_58);
  return this;
}

Assistant:

std::string Usage() const {
    return (command + " [depth <x>] [count <x>] [skip <x>] [leafs <x>] "
                      "[epd] [file <x> (default=" + _TEST_FILE + ")]");
  }